

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

TPZManVector<int,_27> * __thiscall
TPZManVector<int,_27>::operator=(TPZManVector<int,_27> *this,TPZManVector<int,_27> *rval)

{
  int *piVar1;
  int64_t iVar2;
  TPZManVector<int,_27> *in_RSI;
  TPZManVector<int,_27> *in_RDI;
  int i;
  int64_t nel;
  int local_1c;
  
  if (in_RDI != in_RSI) {
    iVar2 = TPZVec<int>::NElements(&in_RSI->super_TPZVec<int>);
    if (((in_RDI->super_TPZVec<int>).fStore != (int *)0x0) &&
       ((in_RDI->super_TPZVec<int>).fStore != in_RDI->fExtAlloc)) {
      piVar1 = (in_RDI->super_TPZVec<int>).fStore;
      if (piVar1 != (int *)0x0) {
        operator_delete__(piVar1);
      }
      (in_RDI->super_TPZVec<int>).fStore = (int *)0x0;
      (in_RDI->super_TPZVec<int>).fNAlloc = 0;
    }
    if (iVar2 < 0x1c) {
      for (local_1c = 0; local_1c < iVar2; local_1c = local_1c + 1) {
        in_RDI->fExtAlloc[local_1c] = in_RSI->fExtAlloc[local_1c];
      }
      for (; local_1c < 0x1b; local_1c = local_1c + 1) {
        in_RDI->fExtAlloc[local_1c] = 0;
      }
      (in_RDI->super_TPZVec<int>).fStore = in_RDI->fExtAlloc;
      (in_RDI->super_TPZVec<int>).fNAlloc = 0;
      (in_RDI->super_TPZVec<int>).fNElements = iVar2;
    }
    else {
      (in_RDI->super_TPZVec<int>).fStore = (in_RSI->super_TPZVec<int>).fStore;
      (in_RDI->super_TPZVec<int>).fNAlloc = iVar2;
      (in_RDI->super_TPZVec<int>).fNElements = iVar2;
    }
  }
  (in_RSI->super_TPZVec<int>).fStore = (int *)0x0;
  (in_RSI->super_TPZVec<int>).fNAlloc = 0;
  (in_RSI->super_TPZVec<int>).fNElements = 0;
  return in_RDI;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}